

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

void lys_notif_free(ly_ctx *ctx,lys_node_notif *notif,
                   _func_void_lys_node_ptr_void_ptr *private_destructor)

{
  int local_24;
  int i;
  _func_void_lys_node_ptr_void_ptr *private_destructor_local;
  lys_node_notif *notif_local;
  ly_ctx *ctx_local;
  
  for (local_24 = 0; local_24 < (int)(uint)notif->must_size; local_24 = local_24 + 1) {
    lys_restr_free(ctx,notif->must + local_24,private_destructor);
  }
  free(notif->must);
  for (local_24 = 0; local_24 < (int)(uint)notif->tpdf_size; local_24 = local_24 + 1) {
    lys_tpdf_free(ctx,notif->tpdf + local_24,private_destructor);
  }
  free(notif->tpdf);
  return;
}

Assistant:

static void
lys_notif_free(struct ly_ctx *ctx, struct lys_node_notif *notif,
               void (*private_destructor)(const struct lys_node *node, void *priv))
{
    int i;

    for (i = 0; i < notif->must_size; i++) {
        lys_restr_free(ctx, &notif->must[i], private_destructor);
    }
    free(notif->must);

    for (i = 0; i < notif->tpdf_size; i++) {
        lys_tpdf_free(ctx, &notif->tpdf[i], private_destructor);
    }
    free(notif->tpdf);
}